

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

void RecWrd(GmfMshSct *msh,void *wrd)

{
  size_t sVar1;
  
  sVar1 = fwrite(wrd,4,1,(FILE *)msh->hdl);
  if (sVar1 == 1) {
    return;
  }
  longjmp((__jmp_buf_tag *)msh->err,-0x1c);
}

Assistant:

static void RecWrd(GmfMshSct *msh, const void *wrd)
{
   // [Bruno] added error control
#ifdef WITH_GMF_AIO
   if(write(msh->FilDes, wrd, WrdSiz) != WrdSiz)
#else
   if(fwrite(wrd, WrdSiz, 1, msh->hdl) != 1)
#endif
      longjmp(msh->err,-28);
}